

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O2

bool __thiscall SQInstance::Get(SQInstance *this,SQObjectPtr *key,SQObjectPtr *val)

{
  bool bVar1;
  int *piVar2;
  uint uVar3;
  SQObject local_28;
  
  bVar1 = SQTable::Get(this->_class->_members,key,val);
  if (bVar1) {
    uVar3 = SUB84((val->super_SQObject)._unVal,0);
    if ((uVar3 >> 0x19 & 1) == 0) {
      SQObjectPtr::operator=
                (val,(SQObjectPtr *)
                     ((long)&(((this->_class->_methods)._vals)->val).super_SQObject._type +
                     (ulong)((uVar3 & 0xffffff) << 5)));
    }
    else {
      uVar3 = (uVar3 & 0xffffff) << 4;
      piVar2 = (int *)((long)&this->_values[0].super_SQObject._type + (ulong)uVar3);
      if (*piVar2 == 0x8010000) {
        piVar2 = (int *)(*(long *)((long)&this->_values[0].super_SQObject._unVal + (ulong)uVar3) +
                        0x18);
      }
      local_28._type = piVar2[0];
      local_28._4_4_ = piVar2[1];
      local_28._unVal = *(SQObjectValue *)(piVar2 + 2);
      SQObjectPtr::operator=(val,&local_28);
    }
  }
  return bVar1;
}

Assistant:

bool Get(const SQObjectPtr &key,SQObjectPtr &val)  {
        if(_class->_members->Get(key,val)) {
            if(_isfield(val)) {
                SQObjectPtr &o = _values[_member_idx(val)];
                val = _realval(o);
            }
            else {
                val = _class->_methods[_member_idx(val)].val;
            }
            return true;
        }
        return false;
    }